

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool __thiscall Trie::insert(Trie *this,Unicode *_unicode)

{
  int iVar1;
  bool bVar2;
  reference puVar3;
  iterator this_00;
  iterator __k;
  mapped_type *pptVar4;
  int *in_RDI;
  bad_alloc *anon_var_0;
  iterator iter;
  uint16_t index;
  trie_node_t *node;
  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
  *in_stack_ffffffffffffff78;
  trie_node_s *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_30;
  unsigned_short local_22;
  mapped_type local_20;
  
  local_20 = *(mapped_type *)(in_RDI + 0xe);
  local_30._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                  in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff78)
    ;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&local_30);
    local_22 = *puVar3;
    this_00 = std::
              map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
              ::find(in_stack_ffffffffffffff78,(key_type *)0x116acf);
    __k = std::
          map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
          ::end(in_stack_ffffffffffffff78);
    bVar2 = std::operator==((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffb8);
    if (bVar2) {
      in_stack_ffffffffffffff88._M_current = (unsigned_short *)operator_new(0x40);
      trie_node_s::trie_node_s(in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff80 =
           (trie_node_s *)
           std::
           map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
           ::operator[]((map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                         *)this_00._M_node,(key_type *)__k._M_node);
      *(unsigned_short **)in_stack_ffffffffffffff80 = in_stack_ffffffffffffff88._M_current;
    }
    pptVar4 = std::
              map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
              ::operator[]((map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                            *)this_00._M_node,(key_type *)__k._M_node);
    local_20 = *pptVar4;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_ffffffffffffff88._M_current,
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  local_20->infoIndex = iVar1;
  return true;
}

Assistant:

bool Trie::insert(Unicode &_unicode)
{
	trie_node_t *node = root;
	uint16_t index;
	auto iter = _unicode.begin();
	for ( ; iter != _unicode.end(); iter++ ) {
		index = *iter;
		if ( node->nextMap.find(index) == node->nextMap.end() ) {
			try {
				node->nextMap[index] = new trie_node_t;
			}
		    catch(const bad_alloc& ) {
				return false;
			}
		}
		node = node->nextMap[index];
	}
	node->infoIndex = size++;
	return true;
}